

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simple_Apu.cpp
# Opt level: O2

void __thiscall Simple_Apu::end_frame(Simple_Apu *this)

{
  ulong end_time;
  
  this->time = 0;
  end_time = this->frame_length ^ 1;
  this->frame_length = end_time;
  Nes_Apu::end_frame(&this->apu,end_time);
  Blip_Buffer::end_frame(&this->buf,this->frame_length);
  return;
}

Assistant:

void Simple_Apu::end_frame()
{
	time = 0;
	frame_length ^= 1;
	apu.end_frame( frame_length );
	buf.end_frame( frame_length );
}